

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

void rtosc_v2args(rtosc_arg_t *args,size_t nargs,char *arg_str,rtosc_va_list_t *ap)

{
  uint uVar1;
  undefined1 *puVar2;
  uint *in_RCX;
  undefined1 *puVar3;
  undefined1 *in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint8_t *midi_tmp;
  uint arg_pos;
  double *local_108;
  undefined8 *local_e8;
  undefined4 *local_d0;
  undefined8 *local_b8;
  undefined8 *local_a0;
  undefined4 *local_88;
  undefined8 *local_70;
  undefined8 *local_50;
  uint local_24;
  undefined1 *local_18;
  
  local_24 = 0;
  local_18 = in_RDX;
  while (local_24 < in_RSI) {
    puVar3 = local_18 + 1;
    switch(*local_18) {
    case 0x53:
    case 0x73:
      uVar1 = *in_RCX;
      if (uVar1 < 0x29) {
        local_b8 = (undefined8 *)((long)(int)uVar1 + *(long *)(in_RCX + 4));
        *in_RCX = uVar1 + 8;
      }
      else {
        local_b8 = *(undefined8 **)(in_RCX + 2);
        *(undefined8 **)(in_RCX + 2) = local_b8 + 1;
      }
      *(undefined8 *)(in_RDI + (ulong)local_24 * 0x10) = *local_b8;
      local_24 = local_24 + 1;
      local_18 = puVar3;
      break;
    default:
      local_18 = puVar3;
      break;
    case 0x62:
      uVar1 = *in_RCX;
      if (uVar1 < 0x29) {
        local_d0 = (undefined4 *)((long)(int)uVar1 + *(long *)(in_RCX + 4));
        *in_RCX = uVar1 + 8;
      }
      else {
        local_d0 = *(undefined4 **)(in_RCX + 2);
        *(undefined4 **)(in_RCX + 2) = local_d0 + 2;
      }
      *(undefined4 *)(in_RDI + (ulong)local_24 * 0x10) = *local_d0;
      uVar1 = *in_RCX;
      if (uVar1 < 0x29) {
        local_e8 = (undefined8 *)((long)(int)uVar1 + *(long *)(in_RCX + 4));
        *in_RCX = uVar1 + 8;
      }
      else {
        local_e8 = *(undefined8 **)(in_RCX + 2);
        *(undefined8 **)(in_RCX + 2) = local_e8 + 1;
      }
      *(undefined8 *)(in_RDI + (ulong)local_24 * 0x10 + 8) = *local_e8;
      local_24 = local_24 + 1;
      local_18 = puVar3;
      break;
    case 99:
    case 0x69:
    case 0x72:
      uVar1 = *in_RCX;
      if (uVar1 < 0x29) {
        local_88 = (undefined4 *)((long)(int)uVar1 + *(long *)(in_RCX + 4));
        *in_RCX = uVar1 + 8;
      }
      else {
        local_88 = *(undefined4 **)(in_RCX + 2);
        *(undefined4 **)(in_RCX + 2) = local_88 + 2;
      }
      *(undefined4 *)(in_RDI + (ulong)local_24 * 0x10) = *local_88;
      local_24 = local_24 + 1;
      local_18 = puVar3;
      break;
    case 100:
      uVar1 = in_RCX[1];
      if (uVar1 < 0xa1) {
        local_70 = (undefined8 *)((long)(int)uVar1 + *(long *)(in_RCX + 4));
        in_RCX[1] = uVar1 + 0x10;
      }
      else {
        local_70 = *(undefined8 **)(in_RCX + 2);
        *(undefined8 **)(in_RCX + 2) = local_70 + 1;
      }
      *(undefined8 *)(in_RDI + (ulong)local_24 * 0x10) = *local_70;
      local_24 = local_24 + 1;
      local_18 = puVar3;
      break;
    case 0x66:
      uVar1 = in_RCX[1];
      if (uVar1 < 0xa1) {
        local_108 = (double *)((long)(int)uVar1 + *(long *)(in_RCX + 4));
        in_RCX[1] = uVar1 + 0x10;
      }
      else {
        local_108 = *(double **)(in_RCX + 2);
        *(double **)(in_RCX + 2) = local_108 + 1;
      }
      *(float *)(in_RDI + (ulong)local_24 * 0x10) = (float)*local_108;
      local_24 = local_24 + 1;
      local_18 = puVar3;
      break;
    case 0x68:
    case 0x74:
      uVar1 = *in_RCX;
      if (uVar1 < 0x29) {
        local_50 = (undefined8 *)((long)(int)uVar1 + *(long *)(in_RCX + 4));
        *in_RCX = uVar1 + 8;
      }
      else {
        local_50 = *(undefined8 **)(in_RCX + 2);
        *(undefined8 **)(in_RCX + 2) = local_50 + 1;
      }
      *(undefined8 *)(in_RDI + (ulong)local_24 * 0x10) = *local_50;
      local_24 = local_24 + 1;
      local_18 = puVar3;
      break;
    case 0x6d:
      uVar1 = *in_RCX;
      if (uVar1 < 0x29) {
        local_a0 = (undefined8 *)((long)(int)uVar1 + *(long *)(in_RCX + 4));
        *in_RCX = uVar1 + 8;
      }
      else {
        local_a0 = *(undefined8 **)(in_RCX + 2);
        *(undefined8 **)(in_RCX + 2) = local_a0 + 1;
      }
      puVar2 = (undefined1 *)*local_a0;
      *(undefined1 *)(in_RDI + (ulong)local_24 * 0x10) = *puVar2;
      *(undefined1 *)(in_RDI + (ulong)local_24 * 0x10 + 1) = puVar2[1];
      *(undefined1 *)(in_RDI + (ulong)local_24 * 0x10 + 2) = puVar2[2];
      *(undefined1 *)(in_RDI + (ulong)local_24 * 0x10 + 3) = puVar2[3];
      local_24 = local_24 + 1;
      local_18 = puVar3;
    }
  }
  return;
}

Assistant:

static void rtosc_v2args(rtosc_arg_t* args, size_t nargs, const char* arg_str,
                         rtosc_va_list_t* ap)
{
    unsigned arg_pos = 0;
    uint8_t *midi_tmp;

    while(arg_pos < nargs)
    {
        switch(*arg_str++) {
            case 'h':
            case 't':
                args[arg_pos++].h = va_arg(ap->a, int64_t);
                break;
            case 'd':
                args[arg_pos++].d = va_arg(ap->a, double);
                break;
            case 'c':
            case 'i':
            case 'r':
                args[arg_pos++].i = va_arg(ap->a, int);
                break;
            case 'm':
                midi_tmp = va_arg(ap->a, uint8_t *);
                args[arg_pos].m[0] = midi_tmp[0];
                args[arg_pos].m[1] = midi_tmp[1];
                args[arg_pos].m[2] = midi_tmp[2];
                args[arg_pos++].m[3] = midi_tmp[3];
                break;
            case 'S':
            case 's':
                args[arg_pos++].s = va_arg(ap->a, const char *);
                break;
            case 'b':
                args[arg_pos].b.len = va_arg(ap->a, int);
                args[arg_pos].b.data = va_arg(ap->a, unsigned char *);
                arg_pos++;
                break;
            case 'f':
                args[arg_pos++].f = va_arg(ap->a, double);
                break;
            default:
                ;
        }
    }
}